

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O0

jsgf_atom_t * jsgf_kleene_new(jsgf_t *jsgf,jsgf_atom_t *atom,int plus)

{
  jsgf_rhs_t *pjVar1;
  jsgf_atom_t *pjVar2;
  glist_t pgVar3;
  jsgf_rule_t *pjVar4;
  jsgf_rhs_t *rhs;
  jsgf_atom_t *rule_atom;
  jsgf_rule_t *rule;
  int plus_local;
  jsgf_atom_t *atom_local;
  jsgf_t *jsgf_local;
  
  pjVar1 = (jsgf_rhs_t *)
           __ckd_calloc__(1,0x10,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                          ,0xa3);
  if (plus == 0) {
    pjVar2 = jsgf_atom_new("<NULL>",1.0);
    pgVar3 = glist_add_ptr((glist_t)0x0,pjVar2);
    pjVar1->atoms = pgVar3;
  }
  else {
    pjVar2 = jsgf_atom_new(atom->name,1.0);
    pgVar3 = glist_add_ptr((glist_t)0x0,pjVar2);
    pjVar1->atoms = pgVar3;
  }
  pjVar4 = jsgf_define_rule(jsgf,(char *)0x0,pjVar1,0);
  pjVar2 = jsgf_atom_new(pjVar4->name,1.0);
  pjVar1 = (jsgf_rhs_t *)
           __ckd_calloc__(1,0x10,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                          ,0xaa);
  pgVar3 = glist_add_ptr((glist_t)0x0,pjVar2);
  pjVar1->atoms = pgVar3;
  pgVar3 = glist_add_ptr(pjVar1->atoms,atom);
  pjVar1->atoms = pgVar3;
  pjVar4->rhs->alt = pjVar1;
  pjVar2 = jsgf_atom_new(pjVar4->name,1.0);
  return pjVar2;
}

Assistant:

jsgf_atom_t *
jsgf_kleene_new(jsgf_t * jsgf, jsgf_atom_t * atom, int plus)
{
    jsgf_rule_t *rule;
    jsgf_atom_t *rule_atom;
    jsgf_rhs_t *rhs;

    /* Generate an "internal" rule of the form (<NULL> | <name> <g0006>) */
    /* Or if plus is true, (<name> | <name> <g0006>) */
    rhs = ckd_calloc(1, sizeof(*rhs));
    if (plus)
        rhs->atoms = glist_add_ptr(NULL, jsgf_atom_new(atom->name, 1.0));
    else
        rhs->atoms = glist_add_ptr(NULL, jsgf_atom_new("<NULL>", 1.0));
    rule = jsgf_define_rule(jsgf, NULL, rhs, 0);
    rule_atom = jsgf_atom_new(rule->name, 1.0);
    rhs = ckd_calloc(1, sizeof(*rhs));
    rhs->atoms = glist_add_ptr(NULL, rule_atom);
    rhs->atoms = glist_add_ptr(rhs->atoms, atom);
    rule->rhs->alt = rhs;

    return jsgf_atom_new(rule->name, 1.0);
}